

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::error_info_injector<boost::lock_error>::error_info_injector
          (error_info_injector<boost::lock_error> *this,lock_error *x)

{
  lock_error::lock_error(&this->super_lock_error,x);
  (this->super_exception).throw_file_ = (char *)0x0;
  (this->super_exception).data_.px_ = (error_info_container *)0x0;
  (this->super_exception).throw_function_ = (char *)0x0;
  (this->super_exception).throw_line_ = -1;
  *(undefined ***)&(this->super_lock_error).super_thread_exception.super_system_error =
       &PTR__error_info_injector_001e38f0;
  (this->super_exception)._vptr_exception = (_func_int **)&PTR__error_info_injector_001e3918;
  return;
}

Assistant:

explicit
            error_info_injector( T const & x ):
                T(x)
                {
                }